

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86assembler.cpp
# Opt level: O0

void __thiscall
asmjit::_abi_1_10::x86::X86BufferWriter::emitImmediate
          (X86BufferWriter *this,uint64_t immValue,FastUInt8 immSize)

{
  ulong uVar1;
  byte in_DL;
  CodeWriter *in_RSI;
  CodeWriter *in_RDI;
  uint64_t imm;
  undefined1 local_11;
  
  local_11 = in_DL;
  if (3 < in_DL) {
    CodeWriter::emit32uLE<unsigned_long>(in_RSI,(unsigned_long)in_RDI);
    in_RSI = (CodeWriter *)((ulong)in_RSI >> 0x20);
    local_11 = in_DL - 4;
  }
  if (local_11 != 0) {
    CodeWriter::emit8<unsigned_long>(in_RDI,(ulong)in_RSI & 0xff);
    uVar1 = (ulong)in_RSI >> 8;
    if (local_11 != 1) {
      CodeWriter::emit8<unsigned_long>(in_RDI,uVar1 & 0xff);
      uVar1 = uVar1 >> 8;
      if (local_11 != 2) {
        CodeWriter::emit8<unsigned_long>(in_RDI,uVar1 & 0xff);
        if (local_11 != 3) {
          CodeWriter::emit8<unsigned_long>(in_RDI,uVar1 >> 8 & 0xff);
        }
      }
    }
  }
  return;
}

Assistant:

ASMJIT_FORCE_INLINE void emitImmediate(uint64_t immValue, FastUInt8 immSize) noexcept {
#if ASMJIT_ARCH_BITS >= 64
    uint64_t imm = immValue;
    if (immSize >= 4) {
      emit32uLE(imm & 0xFFFFFFFFu);
      imm >>= 32;
      immSize = FastUInt8(immSize - 4u);
    }
#else
    uint32_t imm = uint32_t(immValue & 0xFFFFFFFFu);
    if (immSize >= 4) {
      emit32uLE(imm);
      imm = uint32_t(immValue >> 32);
      immSize = FastUInt8(immSize - 4u);
    }
#endif

    if (!immSize)
      return;
    emit8(imm & 0xFFu);
    imm >>= 8;

    if (--immSize == 0)
      return;
    emit8(imm & 0xFFu);
    imm >>= 8;

    if (--immSize == 0)
      return;
    emit8(imm & 0xFFu);
    imm >>= 8;

    if (--immSize == 0)
      return;
    emit8(imm & 0xFFu);
  }